

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_FMGenerate(ym3438_t *chip)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  
  uVar1 = (ulong)(chip->cycles + 0x13) % 0x18;
  uVar2 = (short)(chip->pg_phase[uVar1] >> 10) + chip->fm_mod[uVar1];
  uVar5 = ~(uint)uVar2;
  if ((uVar2 & 0x100) == 0) {
    uVar5 = (uint)uVar2;
  }
  uVar6 = chip->eg_out[uVar1] * 4 + logsinrom[uVar5 & 0xff];
  uVar3 = 0x1fff;
  if (uVar6 < 0x1fff) {
    uVar3 = uVar6;
  }
  uVar4 = (uint)chip->mode_test_21[4] << 0xd ^
          ((uint)exprom[~(uint)uVar3 & 0xff] << 2 | 0x1000) >> ((byte)(uVar3 >> 8) & 0x1f);
  uVar5 = -uVar4;
  if ((uVar2 & 0x200) == 0) {
    uVar5 = uVar4;
  }
  chip->fm_out[uVar1] = (Bit16s)((uint)(int)(short)(uVar5 << 2) >> 2);
  return;
}

Assistant:

void OPN2_FMGenerate(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 19) % 24;
    /* Calculate phase */
    Bit16u phase = (chip->fm_mod[slot] + (chip->pg_phase[slot] >> 10)) & 0x3ff;
    Bit16u quarter;
    Bit16u level;
    Bit16s output;
    if (phase & 0x100)
    {
        quarter = (phase ^ 0xff) & 0xff;
    }
    else
    {
        quarter = phase & 0xff;
    }
    level = logsinrom[quarter];
    /* Apply envelope */
    level += chip->eg_out[slot] << 2;
    /* Transform */
    if (level > 0x1fff)
    {
        level = 0x1fff;
    }
    output = ((exprom[(level & 0xff) ^ 0xff] | 0x400) << 2) >> (level >> 8);
    if (phase & 0x200)
    {
        output = ((~output) ^ (chip->mode_test_21[4] << 13)) + 1;
    }
    else
    {
        output = output ^ (chip->mode_test_21[4] << 13);
    }
    output <<= 2;
    output >>= 2;
    chip->fm_out[slot] = output;
}